

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

pair<bool,_const_char_*> consistentNumberProperty(char *lhs,char *rhs,CompatibleType t)

{
  int *piVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  long *plVar2;
  pair<bool,_const_char_*> pVar3;
  pair<bool,_const_char_*> pVar4;
  char **local_70;
  char **local_68;
  bool local_5b;
  bool local_5a;
  bool local_59;
  long local_58;
  long rnum;
  long local_48;
  long lnum;
  char *null_ptr;
  char *pEnd;
  char *pcStack_28;
  CompatibleType t_local;
  char *rhs_local;
  char *lhs_local;
  char *local_10;
  
  lnum = 0;
  pEnd._4_4_ = t;
  pcStack_28 = rhs;
  rhs_local = lhs;
  local_48 = strtol(lhs,&null_ptr,0);
  if ((null_ptr != rhs_local) && (*null_ptr == '\0')) {
    piVar1 = __errno_location();
    if (*piVar1 != 0x22) {
      local_58 = strtol(pcStack_28,&null_ptr,0);
      if ((null_ptr != pcStack_28) && (*null_ptr == '\0')) {
        piVar1 = __errno_location();
        if (*piVar1 != 0x22) {
          if (pEnd._4_4_ == NumberMaxType) {
            local_5a = true;
            plVar2 = std::max<long>(&local_48,&local_58);
            if (*plVar2 == local_48) {
              local_68 = &rhs_local;
            }
            else {
              local_68 = &stack0xffffffffffffffd8;
            }
            pVar3 = std::make_pair<bool,char_const*&>(&local_5a,local_68);
            lhs_local._0_1_ = pVar3.first;
          }
          else {
            local_5b = true;
            plVar2 = std::min<long>(&local_48,&local_58);
            if (*plVar2 == local_48) {
              local_70 = &rhs_local;
            }
            else {
              local_70 = &stack0xffffffffffffffd8;
            }
            pVar3 = std::make_pair<bool,char_const*&>(&local_5b,local_70);
            lhs_local._0_1_ = pVar3.first;
          }
          goto LAB_0077b321;
        }
      }
      local_59 = false;
      std::pair<bool,_const_char_*>::pair<bool,_true>
                ((pair<bool,_const_char_*> *)&lhs_local,&local_59,(char **)&lnum);
      pVar3.second = local_10;
      pVar3._0_8_ = extraout_RAX_00;
      goto LAB_0077b321;
    }
  }
  rnum._7_1_ = 0;
  std::pair<bool,_const_char_*>::pair<bool,_true>
            ((pair<bool,_const_char_*> *)&lhs_local,(bool *)((long)&rnum + 7),(char **)&lnum);
  pVar3.second = local_10;
  pVar3._0_8_ = extraout_RAX;
LAB_0077b321:
  local_10 = pVar3.second;
  pVar4._1_7_ = pVar3._1_7_;
  pVar4.first = (bool)lhs_local._0_1_;
  pVar4.second = local_10;
  return pVar4;
}

Assistant:

std::pair<bool, const char*> consistentNumberProperty(const char *lhs,
                                                   const char *rhs,
                                                   CompatibleType t)
{
  char *pEnd;

  const char* const null_ptr = 0;

  long lnum = strtol(lhs, &pEnd, 0);
  if (pEnd == lhs || *pEnd != '\0' || errno == ERANGE)
    {
    return std::pair<bool, const char*>(false, null_ptr);
    }

  long rnum = strtol(rhs, &pEnd, 0);
  if (pEnd == rhs || *pEnd != '\0' || errno == ERANGE)
    {
    return std::pair<bool, const char*>(false, null_ptr);
    }

  if (t == NumberMaxType)
    {
    return std::make_pair(true, std::max(lnum, rnum) == lnum ? lhs : rhs);
    }
  else
    {
    return std::make_pair(true, std::min(lnum, rnum) == lnum ? lhs : rhs);
    }
}